

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ArrowButtonEx(char *str_id,ImGuiDir dir,ImVec2 size,ImGuiButtonFlags flags)

{
  ImVec2 p_max;
  bool bVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  float fVar4;
  undefined8 in_XMM0_Qa;
  ImGuiNavHighlightFlags in_stack_00000008;
  ImGuiID in_stack_0000000c;
  ImRect *in_stack_00000010;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  float default_size;
  ImRect bb;
  ImGuiID id;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar5;
  float in_stack_ffffffffffffff5c;
  float fVar6;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  ImGuiWindow *in_stack_ffffffffffffff80;
  ImVec2 *min;
  ImVec2 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  ImGuiID id_00;
  ImRect *in_stack_ffffffffffffff98;
  ImVec2 local_4c;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  undefined1 border;
  float in_stack_ffffffffffffffc4;
  float in_stack_ffffffffffffffc8;
  ImVec2 p_min;
  float local_c;
  float fStack_8;
  bool local_1;
  
  border = (undefined1)((uint)in_stack_ffffffffffffffc0 >> 0x18);
  id_00 = (ImGuiID)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  pIVar3 = GetCurrentWindow();
  if ((pIVar3->SkipItems & 1U) == 0) {
    p_min = (ImVec2)GImGui;
    fVar2 = (float)ImGuiWindow::GetID(in_stack_ffffffffffffff80,
                                      (char *)CONCAT44(in_stack_ffffffffffffff7c,
                                                       in_stack_ffffffffffffff78),
                                      in_stack_ffffffffffffff70);
    min = &(pIVar3->DC).CursorPos;
    local_4c = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         (ImVec2 *)0x1765ee);
    ImRect::ImRect((ImRect *)&stack0xffffffffffffffbc,min,&local_4c);
    fVar4 = GetFrameHeight();
    fStack_8 = (float)((ulong)in_XMM0_Qa >> 0x20);
    if (fStack_8 < fVar4) {
      fVar4 = 0.0;
    }
    else {
      fVar4 = *(float *)((long)p_min + 0x1588);
    }
    ItemSize((ImRect *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff5c);
    bVar1 = ItemAdd((ImRect *)in_stack_ffffffffffffff88,(ImGuiID)((ulong)min >> 0x20),
                    (ImRect *)CONCAT44(fVar4,in_stack_ffffffffffffff78));
    if (bVar1) {
      local_1 = ButtonBehavior(in_stack_ffffffffffffff98,id_00,(bool *)in_stack_ffffffffffffff88,
                               (bool *)min,(ImGuiButtonFlags)fVar4);
      GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                  SUB84(in_stack_ffffffffffffff70,0));
      uVar5 = 1;
      RenderNavHighlight(in_stack_00000010,in_stack_0000000c,in_stack_00000008);
      p_max.y = fVar2;
      p_max.x = in_stack_ffffffffffffffc8;
      RenderFrame(p_min,p_max,(ImU32)in_stack_ffffffffffffffc4,(bool)border,
                  in_stack_ffffffffffffffbc);
      local_c = (float)in_XMM0_Qa;
      fVar6 = 0.5;
      fVar4 = 0.0;
      fVar2 = ImMax<float>(0.0,(local_c - *(float *)((long)p_min + 0x18f8)) * 0.5);
      fVar4 = ImMax<float>(fVar4,(fStack_8 - *(float *)((long)p_min + 0x18f8)) * fVar6);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,fVar2,fVar4);
      operator+((ImVec2 *)CONCAT44(fVar6,uVar5),(ImVec2 *)0x1767f6);
      RenderArrow(stack0x00000070,(ImGuiDir)bb.Max.x,bb.Min.y);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ArrowButtonEx(const char* str_id, ImGuiDir dir, ImVec2 size, ImGuiButtonFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiID id = window->GetID(str_id);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const float default_size = GetFrameHeight();
    ItemSize(bb, (size.y >= default_size) ? g.Style.FramePadding.y : 0.0f);
    if (!ItemAdd(bb, id))
        return false;

    if (window->DC.ItemFlags & ImGuiItemFlags_ButtonRepeat)
        flags |= ImGuiButtonFlags_Repeat;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, g.Style.FrameRounding);
    RenderArrow(bb.Min + ImVec2(ImMax(0.0f, (size.x - g.FontSize) * 0.5f), ImMax(0.0f, (size.y - g.FontSize) * 0.5f)), dir);

    return pressed;
}